

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_inv_gen(REF_INT n,REF_DBL *orig,REF_DBL *inv)

{
  long lVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  uint uVar6;
  REF_STATUS RVar7;
  void *__ptr;
  long lVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  REF_DBL *pRVar15;
  ulong uVar16;
  REF_DBL *pRVar17;
  int iVar18;
  ulong uVar19;
  void *pvVar20;
  long lVar21;
  void *pvVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  
  uVar5 = (ulong)(uint)n;
  __ptr = malloc((ulong)(uint)(n * n) << 3);
  if (__ptr == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x48b,
           "ref_matrix_inv_gen","malloc a of REF_DBL NULL");
    RVar7 = 2;
  }
  else {
    uVar16 = 0;
    uVar14 = 0;
    if (0 < n) {
      uVar14 = (ulong)(uint)n;
    }
    lVar13 = (long)n;
    lVar1 = lVar13 * 8;
    pvVar10 = __ptr;
    for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
      for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
        *(REF_DBL *)((long)pvVar10 + uVar19 * 8) = orig[uVar19];
      }
      orig = orig + lVar13;
      pvVar10 = (void *)((long)pvVar10 + lVar1);
    }
    pRVar17 = inv;
    for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
      for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
        pRVar17[uVar19] = 0.0;
      }
      pRVar17 = pRVar17 + lVar13;
    }
    iVar18 = 0;
    uVar16 = uVar14;
    while (bVar23 = uVar16 != 0, uVar16 = uVar16 - 1, bVar23) {
      inv[iVar18] = 1.0;
      iVar18 = iVar18 + n + 1;
    }
    iVar18 = 1;
    pRVar17 = inv;
    pvVar10 = __ptr;
    pvVar20 = __ptr;
    uVar16 = 0;
    while (uVar16 != uVar14) {
      lVar21 = (long)iVar18;
      pRVar15 = inv + lVar21;
      pvVar22 = (void *)((long)__ptr + lVar21 * 8);
      lVar8 = uVar16 * lVar13;
      uVar19 = uVar16 & 0xffffffff;
      lVar11 = lVar21;
      while( true ) {
        lVar9 = (long)(int)(uint)uVar19;
        if (lVar13 <= lVar11) break;
        dVar24 = *(double *)((long)pvVar20 + lVar11 * 8);
        if (dVar24 <= -dVar24) {
          dVar24 = -dVar24;
        }
        dVar25 = *(double *)((long)__ptr + lVar9 * 8 + lVar8 * 8);
        if (dVar25 <= -dVar25) {
          dVar25 = -dVar25;
        }
        uVar6 = (uint)lVar11;
        if (dVar24 <= dVar25) {
          uVar6 = (uint)uVar19;
        }
        lVar11 = lVar11 + 1;
        uVar19 = (ulong)uVar6;
      }
      if (uVar16 != uVar19) {
        lVar11 = 0;
        uVar19 = uVar5;
        while (bVar23 = uVar19 != 0, uVar19 = uVar19 - 1, bVar23) {
          uVar3 = *(undefined8 *)((long)pvVar10 + lVar11);
          *(undefined8 *)((long)pvVar10 + lVar11) =
               *(undefined8 *)((long)__ptr + lVar11 + lVar9 * 8);
          *(undefined8 *)((long)__ptr + lVar11 + lVar9 * 8) = uVar3;
          uVar3 = *(undefined8 *)((long)pRVar17 + lVar11);
          *(undefined8 *)((long)pRVar17 + lVar11) = *(undefined8 *)((long)inv + lVar11 + lVar9 * 8);
          *(undefined8 *)((long)inv + lVar11 + lVar9 * 8) = uVar3;
          lVar11 = lVar11 + lVar1;
        }
      }
      dVar24 = *(double *)((long)__ptr + uVar16 * 8 + lVar8 * 8);
      dVar25 = dVar24 * 1e+20;
      if (dVar25 <= -dVar25) {
        dVar25 = -dVar25;
      }
      lVar11 = 0;
      uVar19 = uVar14;
      while (bVar23 = uVar19 != 0, uVar19 = uVar19 - 1, bVar23) {
        dVar2 = *(double *)((long)pvVar10 + lVar11);
        dVar29 = dVar2;
        if (dVar2 <= -dVar2) {
          dVar29 = -dVar2;
        }
        if (dVar25 <= dVar29) goto LAB_00199fda;
        *(double *)((long)pvVar10 + lVar11) = dVar2 / dVar24;
        dVar2 = *(double *)((long)pRVar17 + lVar11);
        dVar29 = dVar2;
        if (dVar2 <= -dVar2) {
          dVar29 = -dVar2;
        }
        if (dVar25 <= dVar29) goto LAB_00199fda;
        *(double *)((long)pRVar17 + lVar11) = dVar2 / dVar24;
        lVar11 = lVar11 + lVar1;
      }
      for (; lVar21 < lVar13; lVar21 = lVar21 + 1) {
        dVar24 = *(double *)((long)__ptr + uVar16 * 8 + lVar8 * 8);
        auVar26._0_8_ = dVar24 * 1e+20;
        dVar25 = *(double *)((long)__ptr + lVar21 * 8 + lVar8 * 8);
        auVar26._8_8_ = dVar25;
        auVar28._8_8_ = -dVar25;
        auVar28._0_8_ = -auVar26._0_8_;
        auVar28 = maxpd(auVar26,auVar28);
        if (auVar28._0_8_ <= auVar28._8_8_) goto LAB_00199fda;
        dVar24 = -dVar25 / dVar24;
        lVar11 = 0;
        uVar19 = uVar14;
        while (bVar23 = uVar19 != 0, uVar19 = uVar19 - 1, bVar23) {
          *(double *)((long)pvVar22 + lVar11) =
               *(double *)((long)pvVar10 + lVar11) * dVar24 + *(double *)((long)pvVar22 + lVar11);
          lVar11 = lVar11 + lVar1;
        }
        lVar11 = 0;
        uVar19 = uVar14;
        while (bVar23 = uVar19 != 0, uVar19 = uVar19 - 1, bVar23) {
          *(double *)((long)pRVar15 + lVar11) =
               *(double *)((long)pRVar17 + lVar11) * dVar24 + *(double *)((long)pRVar15 + lVar11);
          lVar11 = lVar11 + lVar1;
        }
        pvVar22 = (void *)((long)pvVar22 + 8);
        pRVar15 = pRVar15 + 1;
      }
      pRVar15 = inv;
      pvVar22 = __ptr;
      for (uVar19 = 0; uVar19 != uVar16; uVar19 = uVar19 + 1) {
        dVar24 = *(double *)((long)__ptr + uVar16 * 8 + lVar8 * 8);
        auVar27._0_8_ = dVar24 * 1e+20;
        dVar25 = *(double *)((long)__ptr + uVar19 * 8 + lVar8 * 8);
        auVar27._8_8_ = dVar25;
        auVar4._8_8_ = -dVar25;
        auVar4._0_8_ = -auVar27._0_8_;
        auVar28 = maxpd(auVar27,auVar4);
        if (auVar28._0_8_ <= auVar28._8_8_) {
LAB_00199fda:
          free(__ptr);
          return 4;
        }
        dVar24 = -dVar25 / dVar24;
        lVar11 = 0;
        uVar12 = uVar14;
        while (bVar23 = uVar12 != 0, uVar12 = uVar12 - 1, bVar23) {
          *(double *)((long)pvVar22 + lVar11) =
               *(double *)((long)pvVar10 + lVar11) * dVar24 + *(double *)((long)pvVar22 + lVar11);
          lVar11 = lVar11 + lVar1;
        }
        lVar11 = 0;
        uVar12 = uVar14;
        while (bVar23 = uVar12 != 0, uVar12 = uVar12 - 1, bVar23) {
          *(double *)((long)pRVar15 + lVar11) =
               *(double *)((long)pRVar17 + lVar11) * dVar24 + *(double *)((long)pRVar15 + lVar11);
          lVar11 = lVar11 + lVar1;
        }
        pvVar22 = (void *)((long)pvVar22 + 8);
        pRVar15 = pRVar15 + 1;
      }
      iVar18 = iVar18 + 1;
      pvVar20 = (void *)((long)pvVar20 + lVar1);
      pvVar10 = (void *)((long)pvVar10 + 8);
      pRVar17 = pRVar17 + 1;
      uVar16 = uVar16 + 1;
    }
    free(__ptr);
    RVar7 = 0;
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_inv_gen(REF_INT n, REF_DBL *orig, REF_DBL *inv) {
  REF_INT i, j, k, best;
  REF_DBL *a;
  REF_DBL pivot, scale, temp;

  ref_malloc(a, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) a[i + n * j] = orig[i + n * j];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) inv[i + n * j] = 0.0;
  for (i = 0; i < n; i++) inv[i + n * i] = 1.0;

  for (j = 0; j < n; j++) {
    /* find the best lower row */
    best = j;
    for (k = j + 1; k < n; k++)
      if (ABS(a[k + n * j]) > ABS(a[best + n * j])) best = k;

    if (best != j) /* if there is a better row then swap */
    {
      for (k = 0; k < n; k++) {
        temp = a[j + n * k];
        a[j + n * k] = a[best + n * k];
        a[best + n * k] = temp;
        temp = inv[j + n * k];
        inv[j + n * k] = inv[best + n * k];
        inv[best + n * k] = temp;
      }
    }

    /* scale row so a[j+n*j] is 1.0 */
    pivot = a[j + n * j];
    for (k = 0; k < n; k++) {
      if (!ref_math_divisible(a[j + k * n], pivot)) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      a[j + k * n] /= pivot;
      if (!ref_math_divisible(inv[j + k * n], pivot)) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      inv[j + k * n] /= pivot;
    }

    /* eliminate lower triangle */
    for (i = j + 1; i < n; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
      for (k = 0; k < n; k++) inv[i + k * n] -= scale * inv[j + k * n];
    }

    /* eliminate upper triangle */
    for (i = 0; i < j; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
      for (k = 0; k < n; k++) inv[i + k * n] -= scale * inv[j + k * n];
    }
  }

  ref_free(a);
  return REF_SUCCESS;
}